

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  reference ppLVar3;
  reference pvVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float *pfVar8;
  reference pvVar9;
  Mat *pMVar10;
  Mat *pMVar11;
  reference pvVar12;
  int iVar13;
  long in_RDI;
  double dVar14;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_2;
  float *bias;
  float *weight;
  int weight_per_outch;
  float sqrt_var;
  int i_1;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  float eps;
  int channels;
  BatchNorm *batchnorm;
  DeconvolutionDepthWise *deconvolutiondepthwise;
  int j;
  int top_blob_index;
  int i;
  size_t layer_count;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  float in_stack_fffffffffffffe60;
  value_type in_stack_fffffffffffffe64;
  Mat *in_stack_fffffffffffffe68;
  float fVar15;
  Mat *in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe80;
  int local_fc;
  int local_ec;
  int local_88;
  vector<float,_std::allocator<float>_> local_80 [2];
  vector<float,_std::allocator<float>_> local_50;
  float local_38;
  int local_34;
  value_type local_30;
  value_type local_28;
  int local_1c;
  value_type local_18;
  int local_14;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (local_10 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (!bVar1) {
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar3)->tops,0);
      local_18 = *pvVar4;
      local_1c = local_14;
      do {
        do {
          do {
            local_1c = local_1c + 1;
            if (local_10 <= (ulong)(long)local_1c) goto LAB_0011d550;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_1c);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffe5c,
                                                      in_stack_fffffffffffffe58));
          } while (bVar1);
          ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar3)->bottoms);
        } while (sVar5 != 1);
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar3)->bottoms,0);
      } while (*pvVar4 != local_18);
LAB_0011d550:
      if ((long)local_1c != local_10) {
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        local_28 = *ppLVar3;
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        __stream = _stderr;
        local_30 = *ppLVar3;
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",uVar6,uVar7);
        local_34 = *(int *)&local_30[1]._vptr_Layer;
        local_38 = *(float *)((long)&local_30[1]._vptr_Layer + 4);
        std::allocator<float>::allocator((allocator<float> *)0x11d65d);
        std::vector<float,_std::allocator<float>_>::vector
                  (in_stack_fffffffffffffe80,
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (allocator_type *)in_stack_fffffffffffffe70);
        std::allocator<float>::~allocator((allocator<float> *)0x11d689);
        std::allocator<float>::allocator((allocator<float> *)0x11d6a8);
        std::vector<float,_std::allocator<float>_>::vector
                  (in_stack_fffffffffffffe80,
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (allocator_type *)in_stack_fffffffffffffe70);
        std::allocator<float>::~allocator((allocator<float> *)0x11d6ce);
        for (local_88 = 0; local_88 < local_34; local_88 = local_88 + 1) {
          pfVar8 = ncnn::Mat::operator[]((Mat *)&local_30[1].bottom_shapes,(long)local_88);
          dVar14 = std::sqrt((double)(ulong)(uint)(*pfVar8 + local_38));
          pfVar8 = ncnn::Mat::operator[]((Mat *)&local_30[2].typeindex,(long)local_88);
          in_stack_fffffffffffffe7c = *pfVar8;
          pfVar8 = ncnn::Mat::operator[]((Mat *)&local_30[1].one_blob_only,(long)local_88);
          fVar15 = *pfVar8;
          pfVar8 = ncnn::Mat::operator[]((Mat *)&local_30[1].name.field_2,(long)local_88);
          in_stack_fffffffffffffe7c =
               in_stack_fffffffffffffe7c - (fVar15 * *pfVar8) / SUB84(dVar14,0);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,(long)local_88);
          *pvVar9 = in_stack_fffffffffffffe7c;
          in_stack_fffffffffffffe80 =
               (vector<float,_std::allocator<float>_> *)
               ncnn::Mat::operator[]((Mat *)&local_30[1].one_blob_only,(long)local_88);
          in_stack_fffffffffffffe78 =
               *(float *)&(in_stack_fffffffffffffe80->
                          super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start / SUB84(dVar14,0);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](local_80,(long)local_88);
          *pvVar9 = in_stack_fffffffffffffe78;
        }
        if (*(int *)&local_28[1].name.field_0x4 == 0) {
          *(undefined4 *)&local_28[1].name.field_0x4 = 1;
          ncnn::Mat::Mat(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         (Allocator *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
          ;
          ncnn::Mat::operator=
                    (in_stack_fffffffffffffe68,
                     (Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          fVar15 = (float)((ulong)in_stack_fffffffffffffe68 >> 0x20);
          ncnn::Mat::~Mat((Mat *)0x11d95e);
          ncnn::Mat::fill(in_stack_fffffffffffffe70,fVar15);
        }
        iVar2 = (int)local_28[1].name._M_string_length / local_34;
        pMVar10 = (Mat *)ncnn::Mat::operator_cast_to_float_
                                   ((Mat *)&local_28[1].bottom_shapes.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_finish);
        in_stack_fffffffffffffe70 = pMVar10;
        pMVar11 = (Mat *)ncnn::Mat::operator_cast_to_float_((Mat *)&local_28[2].type);
        in_stack_fffffffffffffe68 = pMVar11;
        for (local_ec = 0; local_ec < local_34; local_ec = local_ec + 1) {
          iVar13 = iVar2 * local_ec;
          for (local_fc = 0; local_fc < iVar2; local_fc = local_fc + 1) {
            pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](local_80,(long)local_ec)
            ;
            *(float *)((long)&pMVar10->data + (long)local_fc * 4 + (long)iVar13 * 4) =
                 *pvVar9 * *(float *)((long)&pMVar10->data + (long)local_fc * 4 + (long)iVar13 * 4);
          }
          in_stack_fffffffffffffe60 = *(float *)((long)&pMVar11->data + (long)local_ec * 4);
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](local_80,(long)local_ec);
          in_stack_fffffffffffffe64 = *pvVar9;
          pvVar9 = std::vector<float,_std::allocator<float>_>::operator[](&local_50,(long)local_ec);
          *(float *)((long)&pMVar11->data + (long)local_ec * 4) =
               in_stack_fffffffffffffe60 * in_stack_fffffffffffffe64 + *pvVar9;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30->tops,0);
        iVar2 = *pvVar4;
        in_stack_fffffffffffffe58 = iVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_28->tops,0);
        *pvVar4 = in_stack_fffffffffffffe58;
        in_stack_fffffffffffffe5c = local_14;
        pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                             (long)iVar2);
        pvVar12->producer = in_stack_fffffffffffffe5c;
        std::__cxx11::string::operator=((string *)&local_30->type,"ncnnfused");
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i=0; i<channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i=0; i<channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}